

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O2

void kratos::hash_generator_src(Context *context,Generator *generator)

{
  uint64_t hash;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  long local_268;
  ifstream fs;
  undefined8 auStack_180 [36];
  undefined1 local_60 [8];
  string filename;
  string content;
  
  Generator::external_filename_abi_cxx11_((string *)local_60,generator);
  std::ifstream::ifstream(&local_268,(string *)local_60,_S_in);
  filename.field_2._8_8_ = &content._M_string_length;
  content._M_dataplus._M_p = (pointer)0x0;
  content._M_string_length._0_1_ = 0;
  __first._8_8_ = 0xffffffffffffffff;
  __first._M_sbuf = *(streambuf_type **)((long)auStack_180 + *(long *)(local_268 + -0x18));
  std::__cxx11::string::assign<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((string *)(filename.field_2._M_local_buf + 8),__first,
             (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40));
  hash = XXHash64::hash((void *)filename.field_2._8_8_,(uint64_t)content._M_dataplus._M_p,0);
  Context::add_hash(context,generator,hash);
  std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
  std::ifstream::~ifstream(&local_268);
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void hash_generator_src(Context* context, Generator* generator) {
    auto filename = generator->external_filename();
    std::ifstream fs(filename);

    std::string content;
    content.assign(std::istreambuf_iterator<char>(fs), std::istreambuf_iterator<char>());
    uint64_t hash = XXHash64::hash(content.c_str(), content.size(), 0);
    context->add_hash(generator, hash);
}